

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EVPathRemote.cpp
# Opt level: O2

void __thiscall
adios2::EVPathRemote::OpenSimpleFile
          (EVPathRemote *this,string *hostname,int32_t port,string *filename)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  char *pcVar4;
  CMConnection p_Var5;
  ulong local_40;
  pointer local_38;
  
  InitCMData(this);
  uVar3 = create_attr_list();
  uVar1 = attr_atom_from_string("IP_HOST");
  uVar2 = attr_atom_from_string("IP_PORT");
  pcVar4 = strdup((hostname->_M_dataplus)._M_p);
  add_attr(uVar3,uVar1,3,pcVar4);
  add_attr(uVar3,uVar2,1,(long)port);
  p_Var5 = (CMConnection)CMinitiate_conn((this->ev_state).cm,uVar3);
  this->m_conn = p_Var5;
  free_attr_list(uVar3);
  if (this->m_conn != (CMConnection)0x0) {
    local_40 = 0;
    local_38 = (filename->_M_dataplus)._M_p;
    uVar1 = CMCondition_get((this->ev_state).cm);
    local_40 = CONCAT44(local_40._4_4_,uVar1);
    CMCondition_set_client_data((this->ev_state).cm,uVar1,this);
    CMwrite(this->m_conn,(this->ev_state).OpenSimpleFileFormat,&local_40);
    CMCondition_wait((this->ev_state).cm,local_40 & 0xffffffff);
    this->m_Active = true;
  }
  return;
}

Assistant:

void EVPathRemote::OpenSimpleFile(const std::string hostname, const int32_t port,
                                  const std::string filename)
{

    EVPathRemoteCommon::_OpenSimpleFileMsg open_msg;
    InitCMData();
    attr_list contact_list = create_attr_list();
    atom_t CM_IP_PORT = -1;
    atom_t CM_IP_HOSTNAME = -1;
    CM_IP_HOSTNAME = attr_atom_from_string("IP_HOST");
    CM_IP_PORT = attr_atom_from_string("IP_PORT");
    add_attr(contact_list, CM_IP_HOSTNAME, Attr_String, (attr_value)strdup(hostname.c_str()));
    add_attr(contact_list, CM_IP_PORT, Attr_Int4, (attr_value)port);
    m_conn = CMinitiate_conn(ev_state.cm, contact_list);
    free_attr_list(contact_list);
    if (!m_conn)
        return;

    memset(&open_msg, 0, sizeof(open_msg));
    open_msg.FileName = (char *)filename.c_str();
    open_msg.OpenResponseCondition = CMCondition_get(ev_state.cm, m_conn);
    CMCondition_set_client_data(ev_state.cm, open_msg.OpenResponseCondition, (void *)this);
    CMwrite(m_conn, ev_state.OpenSimpleFileFormat, &open_msg);
    CMCondition_wait(ev_state.cm, open_msg.OpenResponseCondition);
    m_Active = true;
}